

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64rapass.cpp
# Opt level: O3

Error __thiscall asmjit::_abi_1_10::a64::ARMRAPass::buildCFG(ARMRAPass *this)

{
  undefined4 uVar1;
  Logger *pLVar2;
  undefined4 uVar3;
  Error EVar4;
  RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder> local_2a8;
  Arch local_18;
  
  local_2a8._cc = (BaseCompiler *)(this->super_BaseRAPass).super_FuncPass.super_Pass._cb;
  local_2a8._curBlock = (RABlock *)0x0;
  local_2a8._retBlock._0_4_ = 0;
  local_2a8._retBlock._4_4_ = 0;
  local_2a8._funcNode._0_4_ = 0;
  local_2a8._36_8_ = 0;
  local_2a8._exitLabelId = 0xffffffff;
  local_2a8._sb.super_String.field_0._large.size = 0;
  local_2a8._sharedAssignmentsMap.super_ZoneVectorBase._data = (void *)0x0;
  local_2a8._sharedAssignmentsMap.super_ZoneVectorBase._size = 0;
  local_2a8._sharedAssignmentsMap.super_ZoneVectorBase._capacity = 0;
  local_2a8._hasCode = false;
  local_2a8._lastLoggedBlock = (RABlock *)0x0;
  local_2a8._logger._0_4_ = 0;
  local_2a8._logger._4_4_ = 0;
  local_2a8._formatOptions._flags = kNone;
  local_2a8._formatOptions._indentation._data[0] = '\0';
  local_2a8._formatOptions._indentation._data[1] = '\0';
  local_2a8._formatOptions._indentation._data[2] = '\0';
  local_2a8._formatOptions._indentation._data[3] = '\0';
  local_2a8._formatOptions._padding._data[0] = 0;
  local_2a8._formatOptions._padding._data[1] = 0;
  local_2a8._sb.super_String.field_0._0_8_ = 0x20;
  local_2a8._sb.super_String.field_0._large.capacity = 0x207;
  local_2a8._sb.super_String.field_0._large.data = local_2a8._sb._embeddedData;
  local_2a8._sb._embeddedData[0] = '\0';
  if (((this->super_BaseRAPass)._diagnosticOptions & kRADebugCFG) != kNone) {
    pLVar2 = (this->super_BaseRAPass)._logger;
    local_2a8._logger._0_4_ = SUB84(pLVar2,0);
    local_2a8._logger._4_4_ = (undefined4)((ulong)pLVar2 >> 0x20);
    if (pLVar2 != (Logger *)0x0) {
      local_2a8._formatOptions._padding._data = *&(pLVar2->_options)._padding._data;
      uVar1 = (pLVar2->_options)._flags;
      uVar3 = (pLVar2->_options)._indentation;
      local_2a8._formatOptions._flags = uVar1;
      local_2a8._formatOptions._indentation._data = (uchar  [4])uVar3;
    }
  }
  local_18 = ((local_2a8._cc)->super_BaseBuilder).super_BaseEmitter._environment._arch;
  local_2a8._pass = &this->super_BaseRAPass;
  EVar4 = RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>::run(&local_2a8);
  String::reset(&local_2a8._sb.super_String);
  return EVar4;
}

Assistant:

static inline RATiedFlags raRegRwFlags(OpRWFlags flags) noexcept {
  return raUseOutFlagsFromRWFlags(flags);
}